

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

void __thiscall
BufferedReader::setFileIterator(BufferedReader *this,FileNameIterator *itr,int readerID)

{
  iterator iVar1;
  int local_1c;
  
  local_1c = readerID;
  if (readerID != -1) {
    std::mutex::lock(&this->m_readersMtx);
    iVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
            ::find(&(this->m_readers)._M_t,&local_1c);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->m_readers)._M_t._M_impl.super__Rb_tree_header) {
      (iVar1._M_node[1]._M_parent)->_M_right = (_Base_ptr)itr;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
    return;
  }
  __assert_fail("readerID != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/bufferedReader.cpp"
                ,299,"void BufferedReader::setFileIterator(FileNameIterator *, const int)");
}

Assistant:

void BufferedReader::setFileIterator(FileNameIterator* itr, const int readerID)
{
    assert(readerID != -1);
    std::lock_guard lock(m_readersMtx);
    const auto reader = m_readers.find(readerID);
    if (reader != m_readers.end())
        reader->second->itr = itr;
}